

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O1

pair<subprocess::Buffer,_subprocess::Buffer> * __thiscall
subprocess::detail::Communication::communicate
          (pair<subprocess::Buffer,_subprocess::Buffer> *__return_storage_ptr__,Communication *this,
          char *msg,size_t length)

{
  Streams *pSVar1;
  FILE *__s;
  pointer pcVar2;
  pointer pcVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  int *piVar8;
  ssize_t sVar9;
  OSError *pOVar10;
  bool bVar11;
  long lVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar13;
  int iVar14;
  long in_FS_OFFSET;
  ErrBuffer ebuf;
  OutBuffer obuf;
  int local_cc;
  vector<char,_std::allocator<char>_> local_b8;
  size_t sStack_a0;
  vector<char,_std::allocator<char>_> local_98;
  size_t sStack_80;
  string local_70;
  element_type *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar1 = this->stream_;
  local_50[0] = (pSVar1->input_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_50[1] = (pSVar1->output_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_50[2] = (pSVar1->error_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar5 = 0;
  lVar12 = 0;
  do {
    iVar5 = iVar5 + (uint)(*(long *)((long)local_50 + lVar12) == 0);
    lVar12 = lVar12 + 8;
  } while (lVar12 != 0x18);
  if (iVar5 < 2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      communicate_threaded(__return_storage_ptr__,this,msg,length);
      return __return_storage_ptr__;
    }
    goto LAB_0073c98e;
  }
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sStack_80 = 0;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sStack_a0 = 0;
  local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  __s = (FILE *)(pSVar1->input_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (__s == (FILE *)0x0) {
    if ((pSVar1->output_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::vector<char,_std::allocator<char>_>::resize(&local_98,this->out_buf_cap_);
      iVar5 = util::read_all((this->stream_->output_).
                             super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                             &local_98);
      if (iVar5 == -1) {
        pOVar10 = (OSError *)__cxa_allocate_exception(0x10);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"read to obuf failed","");
        piVar8 = __errno_location();
        OSError::OSError(pOVar10,&local_70,*piVar8);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pOVar10,&OSError::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_0073c98e;
      }
      sStack_80 = (size_t)iVar5;
      pSVar1 = this->stream_;
      (pSVar1->output_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      this_00 = (pSVar1->output_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (pSVar1->output_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      goto LAB_0073c601;
    }
    if (local_50[2] != (element_type *)0x0) {
      std::vector<char,_std::allocator<char>_>::resize(&local_b8,this->err_buf_cap_);
      pcVar3 = local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pcVar2 = local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar5 = fileno((FILE *)(this->stream_->error_).
                             super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      iVar13 = 0;
      iVar14 = 0;
      do {
        sVar9 = read(iVar5,pcVar2 + iVar13,(long)pcVar3 - (long)(pcVar2 + iVar13));
        bVar11 = true;
        iVar6 = (int)sVar9;
        iVar4 = iVar13;
        if (iVar6 != 0) {
          iVar4 = local_cc;
          if (iVar6 == -1) {
            piVar8 = __errno_location();
            if (iVar14 < 0x32 && *piVar8 == 4) {
              iVar14 = iVar14 + 1;
              bVar11 = false;
            }
            else {
              local_cc = -1;
              iVar4 = local_cc;
            }
          }
          else {
            iVar13 = iVar13 + iVar6;
            bVar11 = false;
          }
        }
        local_cc = iVar4;
      } while (!bVar11);
      if (local_cc == -1) {
        pOVar10 = (OSError *)__cxa_allocate_exception(0x10);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"read to ebuf failed","");
        piVar8 = __errno_location();
        OSError::OSError(pOVar10,&local_70,*piVar8);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pOVar10,&OSError::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_0073c98e;
      }
      sStack_a0 = (size_t)local_cc;
      pSVar1 = this->stream_;
      (pSVar1->error_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      this_00 = (pSVar1->error_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (pSVar1->error_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0073c60b;
      goto LAB_0073c606;
    }
  }
  else {
    if ((msg != (char *)0x0) && (sVar7 = fwrite(msg,1,length,__s), (int)sVar7 < (int)length)) {
      piVar8 = __errno_location();
      if ((*piVar8 != 0x16) && (*piVar8 != 0x20)) {
        pOVar10 = (OSError *)__cxa_allocate_exception(0x10);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"fwrite error","");
        OSError::OSError(pOVar10,&local_70,*piVar8);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pOVar10,&OSError::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_0073c98e;
      }
    }
    pSVar1 = this->stream_;
    (pSVar1->input_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    this_00 = (pSVar1->input_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (pSVar1->input_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0073c601:
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0073c606:
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
LAB_0073c60b:
  (__return_storage_ptr__->first).buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (__return_storage_ptr__->first).buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (__return_storage_ptr__->first).buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (__return_storage_ptr__->first).length = sStack_80;
  (__return_storage_ptr__->second).buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (__return_storage_ptr__->second).buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (__return_storage_ptr__->second).buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (__return_storage_ptr__->second).length = sStack_a0;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0073c98e:
  __stack_chk_fail();
}

Assistant:

inline std::pair<OutBuffer, ErrBuffer>
  Communication::communicate(const char* msg, size_t length)
  {
    // Optimization from subprocess.py
    // If we are using one pipe, or no pipe
    // at all, using select() or threads is unnecessary.
    auto hndls = {stream_->input(), stream_->output(), stream_->error()};
    int count = std::count(std::begin(hndls), std::end(hndls), nullptr);
    const int len_conv = length;

    if (count >= 2) {
      OutBuffer obuf;
      ErrBuffer ebuf;
      if (stream_->input()) {
        if (msg) {
          int wbytes = std::fwrite(msg, sizeof(char), length, stream_->input());
          if (wbytes < len_conv) {
            if (errno != EPIPE && errno != EINVAL) {
              throw OSError("fwrite error", errno);
            }
          }
        }
        // Close the input stream
        stream_->input_.reset();
      } else if (stream_->output()) {
        // Read till EOF
        // ATTN: This could be blocking, if the process
        // at the other end screws up, we get screwed as well
        obuf.add_cap(out_buf_cap_);

        int rbytes = util::read_all(
                            stream_->output(),
                            obuf.buf);

        if (rbytes == -1) {
          throw OSError("read to obuf failed", errno);
        }

        obuf.length = rbytes;
        // Close the output stream
        stream_->output_.reset();

      } else if (stream_->error()) {
        // Same screwness applies here as well
        ebuf.add_cap(err_buf_cap_);

        int rbytes = util::read_atmost_n(
                                  stream_->error(),
                                  ebuf.buf.data(),
                                  ebuf.buf.size());

        if (rbytes == -1) {
          throw OSError("read to ebuf failed", errno);
        }

        ebuf.length = rbytes;
        // Close the error stream
        stream_->error_.reset();
      }
      return std::make_pair(std::move(obuf), std::move(ebuf));
    }

    return communicate_threaded(msg, length);
  }